

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::js::anon_unknown_0::FileDeduplicator::AddFile
          (FileDeduplicator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *filenames,void *desc)

{
  mapped_type pvVar1;
  bool bVar2;
  mapped_type *this_00;
  mapped_type *ppvVar3;
  mapped_type *pmVar4;
  mapped_type local_38;
  mapped_type short_name_desc;
  _Self local_28;
  mapped_type local_20;
  void *desc_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *filenames_local;
  FileDeduplicator *this_local;
  
  local_20 = desc;
  desc_local = filenames;
  filenames_local =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
       ::find(&this->descs_by_shortname_,&filenames->first);
  short_name_desc =
       (mapped_type)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
       ::end(&this->descs_by_shortname_);
  bVar2 = std::operator!=(&local_28,(_Self *)&short_name_desc);
  if (bVar2) {
    ppvVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
              ::operator[](&this->descs_by_shortname_,&filenames->first);
    local_38 = *ppvVar3;
    pmVar4 = std::
             map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->allowed_descs_full_name_,&local_38);
    this_00 = std::
              map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->allowed_descs_actual_name_,&local_38);
    std::__cxx11::string::operator=((string *)this_00,(string *)pmVar4);
  }
  pvVar1 = local_20;
  ppvVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
            ::operator[](&this->descs_by_shortname_,&filenames->first);
  *ppvVar3 = pvVar1;
  pmVar4 = std::
           map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->allowed_descs_actual_name_,&local_20);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)filenames);
  pmVar4 = std::
           map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->allowed_descs_full_name_,&local_20);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&filenames->second);
  return true;
}

Assistant:

bool AddFile(const std::pair<std::string, std::string> filenames,
               const void* desc) {
    if (descs_by_shortname_.find(filenames.first) !=
        descs_by_shortname_.end()) {
      // Change old pointer's actual name to full name.
      auto short_name_desc = descs_by_shortname_[filenames.first];
      allowed_descs_actual_name_[short_name_desc] =
          allowed_descs_full_name_[short_name_desc];
    }
    descs_by_shortname_[filenames.first] = desc;
    allowed_descs_actual_name_[desc] = filenames.first;
    allowed_descs_full_name_[desc] = filenames.second;

    return true;
  }